

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::IndexTableSegment::Dump(IndexTableSegment *this,FILE *stream)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  size_type sVar4;
  char local_98 [8];
  char identbuf [128];
  FILE *stream_local;
  IndexTableSegment *this_local;
  
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,(FILE *)identbuf._120_8_);
  uVar1 = identbuf._120_8_;
  pcVar3 = Rational::EncodeString(&this->IndexEditRate,local_98,0x80);
  fprintf((FILE *)uVar1,"  IndexEditRate      = %s\n",pcVar3);
  uVar1 = identbuf._120_8_;
  pcVar3 = i64sz(this->IndexStartPosition,local_98);
  fprintf((FILE *)uVar1,"  IndexStartPosition = %s\n",pcVar3);
  uVar1 = identbuf._120_8_;
  pcVar3 = i64sz(this->IndexDuration,local_98);
  fprintf((FILE *)uVar1,"  IndexDuration      = %s\n",pcVar3);
  fprintf((FILE *)identbuf._120_8_,"  EditUnitByteCount  = %u\n",(ulong)this->EditUnitByteCount);
  fprintf((FILE *)identbuf._120_8_,"  IndexSID           = %u\n",(ulong)this->IndexSID);
  fprintf((FILE *)identbuf._120_8_,"  BodySID            = %u\n",(ulong)this->BodySID);
  fprintf((FILE *)identbuf._120_8_,"  SliceCount         = %hhu\n",(ulong)this->SliceCount);
  fprintf((FILE *)identbuf._120_8_,"  PosTableCount      = %hhu\n",(ulong)this->PosTableCount);
  fprintf((FILE *)identbuf._120_8_,"  DeltaEntryArray:\n");
  FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
  ::Dump(&(this->DeltaEntryArray).
          super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
         ,(FILE *)identbuf._120_8_,0);
  bVar2 = std::
          vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
          ::empty(&(this->IndexEntryArray).
                   super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
                   .
                   super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                 );
  if (bVar2) {
    fprintf((FILE *)identbuf._120_8_,"  IndexEntryArray: NO ENTRIES\n");
  }
  else {
    sVar4 = std::
            vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
            ::size(&(this->IndexEntryArray).
                    super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
                    .
                    super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                  );
    uVar1 = identbuf._120_8_;
    if (sVar4 < 1000) {
      fprintf((FILE *)identbuf._120_8_,"  IndexEntryArray:\n");
      FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
      ::Dump(&(this->IndexEntryArray).
              super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
             ,(FILE *)identbuf._120_8_,0);
    }
    else {
      sVar4 = std::
              vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
              ::size(&(this->IndexEntryArray).
                      super_FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>_>
                      .
                      super_vector<ASDCP::MXF::IndexTableSegment::IndexEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::IndexEntry>_>
                    );
      fprintf((FILE *)uVar1,"  IndexEntryArray: %lu entries\n",sVar4);
    }
  }
  return;
}

Assistant:

void
ASDCP::MXF::IndexTableSegment::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  fprintf(stream, "  IndexEditRate      = %s\n",  IndexEditRate.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  IndexStartPosition = %s\n",  i64sz(IndexStartPosition, identbuf));
  fprintf(stream, "  IndexDuration      = %s\n",  i64sz(IndexDuration, identbuf));
  fprintf(stream, "  EditUnitByteCount  = %u\n",  EditUnitByteCount);
  fprintf(stream, "  IndexSID           = %u\n",  IndexSID);
  fprintf(stream, "  BodySID            = %u\n",  BodySID);
  fprintf(stream, "  SliceCount         = %hhu\n", SliceCount);
  fprintf(stream, "  PosTableCount      = %hhu\n", PosTableCount);

  fprintf(stream, "  DeltaEntryArray:\n");  DeltaEntryArray.Dump(stream);

  if ( IndexEntryArray.empty() )
    {
      fprintf(stream, "  IndexEntryArray: NO ENTRIES\n");
    }
  else if ( IndexEntryArray.size() < 1000 )
    {
      fprintf(stream, "  IndexEntryArray:\n");
      IndexEntryArray.Dump(stream);
    }
  else
    {
      fprintf(stream, "  IndexEntryArray: %lu entries\n", IndexEntryArray.size());
    }
}